

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O2

void HydroUtils::EB_ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,Array4<const_double> *vfrac,int ncomp,Geometry *geom,
               Real mult,bool fluxes_are_area_weighted)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  double *pdVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  ulong uVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  double dVar68;
  
  dVar2 = (geom->super_CoordSys).inv_dx[0];
  dVar3 = (geom->super_CoordSys).inv_dx[1];
  dVar4 = (geom->super_CoordSys).inv_dx[2];
  pdVar25 = vfrac->p;
  lVar26 = vfrac->jstride;
  lVar27 = vfrac->kstride;
  iVar6 = (vfrac->begin).x;
  iVar7 = (vfrac->begin).y;
  iVar8 = (vfrac->begin).z;
  pdVar28 = div->p;
  lVar29 = div->jstride;
  lVar30 = div->kstride;
  lVar31 = div->nstride;
  lVar45 = (long)(div->begin).x;
  iVar9 = (div->begin).y;
  iVar10 = (div->begin).z;
  pdVar32 = fx->p;
  lVar33 = fx->jstride;
  lVar34 = fx->kstride;
  lVar35 = fx->nstride;
  iVar11 = (fx->begin).x;
  iVar12 = (fx->begin).y;
  iVar13 = (fx->begin).z;
  pdVar36 = fy->p;
  lVar37 = fy->jstride;
  lVar38 = fy->kstride;
  lVar39 = fy->nstride;
  iVar14 = (fy->begin).x;
  iVar15 = (fy->begin).y;
  iVar16 = (fy->begin).z;
  pdVar40 = fz->p;
  lVar41 = fz->jstride;
  lVar42 = fz->kstride;
  lVar43 = fz->nstride;
  lVar46 = (long)(fz->begin).x;
  iVar17 = (fz->begin).y;
  iVar18 = (fz->begin).z;
  iVar19 = (bx->smallend).vect[0];
  iVar20 = (bx->smallend).vect[1];
  iVar21 = (bx->smallend).vect[2];
  iVar22 = (bx->bigend).vect[0];
  iVar23 = (bx->bigend).vect[1];
  iVar24 = (bx->bigend).vect[2];
  uVar61 = 0;
  uVar47 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar47 = uVar61;
  }
  for (; uVar61 != uVar47; uVar61 = uVar61 + 1) {
    lVar48 = uVar61 * lVar31;
    lVar49 = uVar61 * lVar35;
    lVar50 = uVar61 * lVar39;
    lVar51 = uVar61 * lVar43;
    lVar64 = (long)iVar21;
    while (lVar64 <= iVar24) {
      lVar53 = lVar64 - iVar8;
      lVar1 = lVar64 + 1;
      lVar54 = (lVar64 - iVar10) * lVar30;
      lVar55 = (lVar64 - iVar13) * lVar34;
      lVar56 = (lVar64 - iVar16) * lVar38;
      lVar62 = ((int)lVar1 - iVar18) * lVar42;
      lVar65 = (lVar64 - iVar18) * lVar42;
      lVar66 = (long)iVar20;
      while (lVar64 = lVar1, lVar66 <= iVar23) {
        if (iVar22 < iVar19) {
          lVar66 = lVar66 + 1;
        }
        else {
          lVar57 = lVar66 - iVar7;
          lVar58 = (lVar66 - iVar9) * lVar29;
          lVar59 = (lVar66 - iVar12) * lVar33;
          lVar64 = lVar66 + 1;
          lVar60 = (lVar66 - iVar15) * lVar37;
          lVar63 = (lVar66 - iVar17) * lVar41;
          lVar52 = (long)iVar19;
          do {
            dVar5 = pdVar25[lVar53 * lVar27 + lVar57 * lVar26 + (lVar52 - iVar6)];
            iVar44 = (int)lVar52;
            if (dVar5 <= 0.0) {
              pdVar28[lVar48 + lVar54 + lVar58 + (lVar52 - lVar45)] = 0.0;
            }
            else {
              dVar68 = pdVar32[lVar49 + lVar55 + lVar59 + ((iVar44 + 1) - iVar11)] -
                       pdVar32[lVar49 + lVar55 + lVar59 + (lVar52 - iVar11)];
              lVar66 = lVar52 - iVar14;
              if (fluxes_are_area_weighted) {
                lVar67 = lVar52 - lVar46;
                pdVar28[lVar48 + lVar54 + lVar58 + (lVar52 - lVar45)] =
                     ((((dVar68 + pdVar36[lVar50 + lVar56 + ((int)lVar64 - iVar15) * lVar37 + lVar66
                                         ]) - pdVar36[lVar50 + lVar56 + lVar60 + lVar66]) +
                      pdVar40[lVar63 + lVar67 + lVar62 + lVar51]) -
                     pdVar40[lVar63 + lVar67 + lVar65 + lVar51]) *
                     ((dVar2 * dVar3 * dVar4 * mult) / dVar5);
              }
              else {
                lVar67 = lVar52 - lVar46;
                pdVar28[lVar48 + lVar54 + lVar58 + (lVar52 - lVar45)] =
                     ((pdVar40[lVar63 + lVar67 + lVar62 + lVar51] -
                      pdVar40[lVar63 + lVar67 + lVar65 + lVar51]) * dVar4 +
                     dVar68 * dVar2 +
                     (pdVar36[lVar50 + lVar56 + ((int)lVar64 - iVar15) * lVar37 + lVar66] -
                     pdVar36[lVar50 + lVar56 + lVar60 + lVar66]) * dVar3) * (mult / dVar5);
              }
            }
            lVar52 = lVar52 + 1;
            lVar66 = lVar64;
          } while (iVar44 + 1 != iVar22 + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void
HydroUtils::EB_ComputeDivergence ( Box const& bx,
                                   Array4<Real> const& div,
                                   AMREX_D_DECL( Array4<Real const> const& fx,
                                                 Array4<Real const> const& fy,
                                                 Array4<Real const> const& fz),
                                   Array4<Real const> const& vfrac,
                                   const int ncomp, Geometry const& geom,
                                   const Real mult,
                                   const bool fluxes_are_area_weighted )
{
    const auto dxinv = geom.InvCellSizeArray();

#if (AMREX_SPACEDIM==3)
    Real qvol = dxinv[0] * dxinv[1] * dxinv[2];
#else
    Real qvol = dxinv[0] * dxinv[1];
#endif

    amrex::ParallelFor(bx, ncomp, [=]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if ( vfrac(i,j,k) > 0.)
        {
            if (fluxes_are_area_weighted)
                div(i,j,k,n) =  mult * qvol / vfrac(i,j,k) *
                    (
                             fx(i+1,j,k,n) -  fx(i,j,k,n)
                           + fy(i,j+1,k,n) -  fy(i,j,k,n)
#if (AMREX_SPACEDIM==3)
                           + fz(i,j,k+1,n) -  fz(i,j,k,n)
#endif
                    );
            else
                div(i,j,k,n) =  mult / vfrac(i,j,k) *
                    (
                             (fx(i+1,j,k,n) -  fx(i,j,k,n)) * dxinv[0]
                           + (fy(i,j+1,k,n) -  fy(i,j,k,n)) * dxinv[1]
#if (AMREX_SPACEDIM==3)
                           + (fz(i,j,k+1,n) -  fz(i,j,k,n)) * dxinv[2]
#endif
                    );
        }
        else
        {
            div(i,j,k,n) = 0.0;
        }

    });
}